

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::encode_traits<__int128,char,void>::
     encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (undefined8 *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4)

{
  undefined8 uVar1;
  undefined1 val [16];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> j;
  basic_json_visitor<char> *in_stack_ffffffffffffff78;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  allocator_type *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  allocator<char> local_39 [17];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 *local_10;
  
  uVar1 = *param_1;
  this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)param_1[1];
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  std::allocator<char>::allocator();
  val._8_8_ = uVar1;
  val._0_8_ = in_stack_ffffffffffffffa0;
  json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,___int128,_void>
  ::to_json((__int128)val,in_stack_ffffffffffffff98);
  std::allocator<char>::~allocator(local_39);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (this,in_stack_ffffffffffffff78,(error_code *)0x383bcd);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x383bd9);
  return;
}

Assistant:

static void encode(std::true_type,
                           const T& val, 
                           basic_json_visitor<CharT>& encoder,
                           const Json& /*proto*/, 
                           std::error_code& ec)
        {
            auto j = json_type_traits<Json,T>::to_json(val);
            j.dump(encoder, ec);
        }